

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynContinue * ParseContinue(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynNumber *number;
  undefined4 extraout_var;
  Lexeme *end;
  SynContinue *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_continue) {
    ctx->currentLexeme = begin + 1;
    number = ParseNumber(ctx);
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_semicolon,"ERROR: continue statement must be followed by \';\' or a constant"
              );
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynContinue *)CONCAT44(extraout_var,iVar1);
    end = ParseContext::Previous(ctx);
    SynContinue::SynContinue(this,begin,end,number);
  }
  else {
    this = (SynContinue *)0x0;
  }
  return this;
}

Assistant:

SynContinue* ParseContinue(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_continue))
	{
		// Optional
		SynNumber *node = ParseNumber(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: continue statement must be followed by ';' or a constant");

		return new (ctx.get<SynContinue>()) SynContinue(start, ctx.Previous(), node);
	}

	return NULL;
}